

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

loc_conflict
choose_random_entrance
          (chunk_conflict *c,wchar_t ridx,loc_conflict *tgt,wchar_t bias,loc_conflict *exc,
          wchar_t nexc)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  undefined4 *p;
  loc_conflict lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int local_4c;
  
  if ((ridx < L'\0') || (dun->cent_n <= ridx)) {
    __assert_fail("ridx >= 0 && ridx < dun->cent_n",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0xcc,
                  "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                 );
  }
  if (0 < dun->ent_n[(uint)ridx]) {
    p = (undefined4 *)mem_alloc((ulong)(uint)dun->ent_n[(uint)ridx] * 4 + 4);
    *p = 0;
    if (0 < dun->ent_n[(uint)ridx]) {
      lVar10 = 0;
      local_4c = 0;
      do {
        _Var1 = square_is_granite_with_flag(c,(loc_conflict)dun->ent[(uint)ridx][lVar10],L'\f');
        if (_Var1) {
          if (L'\0' < nexc) {
            uVar9 = 0;
            do {
              lVar4 = loc_diff((loc_conflict)dun->ent[(uint)ridx][lVar10],exc[uVar9]);
              uVar8 = lVar4.x;
              uVar5 = -uVar8;
              if (0 < (int)uVar8) {
                uVar5 = uVar8;
              }
              if (uVar5 < 2) {
                uVar6 = lVar4.y;
                uVar5 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar5 = uVar6;
                }
                if ((uVar5 < 2) && (((ulong)lVar4 >> 0x20 != 0 || (uVar8 != 0)))) goto LAB_0014b542;
              }
              uVar9 = uVar9 + 1;
            } while ((uint)nexc != uVar9);
          }
          if (tgt == (loc_conflict *)0x0) {
            iVar7 = p[lVar10] + 1;
          }
          else {
            if (bias < L'\0') {
              __assert_fail("bias >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                            ,0xf1,
                            "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                           );
            }
            wVar2 = distance((loc_conflict)dun->ent[(uint)ridx][lVar10],*tgt);
            if (wVar2 == L'\0') {
              mem_free(p);
              return (loc_conflict)dun->ent[(uint)ridx][lVar10];
            }
            iVar7 = bias - wVar2;
            if (iVar7 < 2) {
              iVar7 = 1;
            }
            iVar7 = iVar7 * iVar7 + p[lVar10];
          }
          p[lVar10 + 1] = iVar7;
          local_4c = local_4c + 1;
        }
        else {
LAB_0014b542:
          p[lVar10 + 1] = p[lVar10];
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < dun->ent_n[(uint)ridx]);
      if (0 < local_4c) {
        uVar3 = Rand_div(p[dun->ent_n[(uint)ridx]]);
        uVar5 = dun->ent_n[(uint)ridx];
        uVar9 = 0;
        if (uVar5 == 1) {
          lVar10 = 1;
        }
        else {
          do {
            uVar8 = (int)(uVar5 + (int)uVar9) / 2;
            if ((int)p[(int)uVar8] <= (int)uVar3) {
              uVar9 = (ulong)uVar8;
              uVar8 = uVar5;
            }
            uVar5 = uVar8;
          } while ((int)uVar9 != uVar5 - 1);
          uVar9 = (ulong)(int)uVar9;
          lVar10 = (long)(int)uVar5;
        }
        if (((int)p[uVar9] <= (int)uVar3) && ((int)uVar3 < (int)p[lVar10])) {
          mem_free(p);
          return (loc_conflict)dun->ent[(uint)ridx][uVar9];
        }
        __assert_fail("accum[low] <= chosen && accum[high] > chosen",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                      ,0x115,
                      "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                     );
      }
    }
    mem_free(p);
  }
  lVar4 = loc(0,0);
  return lVar4;
}

Assistant:

static struct loc choose_random_entrance(struct chunk *c, int ridx,
	const struct loc *tgt, int bias, const struct loc *exc, int nexc)
{
	assert(ridx >= 0 && ridx < dun->cent_n);
	if (dun->ent_n[ridx] > 0) {
		int nchoice = 0;
		int *accum = mem_alloc((dun->ent_n[ridx] + 1) *
			sizeof(*accum));
		int i;

		accum[0] = 0;
		for (i = 0; i < dun->ent_n[ridx]; ++i) {
			bool included = square_is_granite_with_flag(c,
				dun->ent[ridx][i], SQUARE_WALL_OUTER);

			if (included) {
				int j = 0;

				while (1) {
					struct loc diff;

					if (j >= nexc) {
						break;
					}
					diff = loc_diff(dun->ent[ridx][i],
						exc[j]);
					if (ABS(diff.x) <= 1 &&
							ABS(diff.y) <= 1 &&
							(diff.x != 0 ||
							diff.y != 0)) {
						included = false;
						break;
					}
					++j;
				}
			}
			if (included) {
				if (tgt) {
					int d, biased;

					assert(bias >= 0);
					d = distance(dun->ent[ridx][i], *tgt);
					if (d == 0) {
						/*
						 * There's an exact match.  Use
						 * it.
						 */
						mem_free(accum);
						return dun->ent[ridx][i];
					}

					biased = MAX(1, bias - d);
					/*
					 * Squaring here is just a guess without
					 * any specific reason to back it.
					 */
					accum[i + 1] = accum[i] +
						biased * biased;
				} else {
					accum[i + 1] = accum[i] + 1;
				}
				++nchoice;
			} else {
				accum[i + 1] = accum[i];
			}
		}
		if (nchoice > 0) {
			int chosen = randint0(accum[dun->ent_n[ridx]]);
			int low = 0, high = dun->ent_n[ridx];

			/* Locate the selection by binary search. */
			while (1) {
				int mid;

				if (low == high - 1) {
					assert(accum[low] <= chosen &&
						accum[high] > chosen);
					mem_free(accum);
					return dun->ent[ridx][low];
				}
				mid = (low + high) / 2;
				if (accum[mid] <= chosen) {
					low = mid;
				} else {
					high = mid;
				}
			}
		}
		mem_free(accum);
	}

	/* There's no satisfactory marked entrances. */
	return loc(0, 0);
}